

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_mpi.c
# Opt level: O0

REF_STATUS
ref_mpi_allconcat(REF_MPI ref_mpi,REF_INT ldim,REF_INT my_size,void *my_array,REF_INT *total_size,
                 REF_INT **source,void **concatenated,REF_TYPE type)

{
  uint uVar1;
  REF_INT *counts_00;
  REF_INT *pRVar2;
  void *pvVar3;
  REF_STATUS ref_private_macro_code_rss_2;
  REF_STATUS ref_private_macro_code_rss_1;
  REF_LONG ref_private_status_reis_bi;
  REF_LONG ref_private_status_reis_ai;
  REF_STATUS ref_private_macro_code_rss;
  REF_INT *counts;
  int local_40;
  REF_INT tot;
  REF_INT i;
  REF_INT proc;
  REF_INT **source_local;
  REF_INT *total_size_local;
  void *my_array_local;
  REF_INT my_size_local;
  REF_INT ldim_local;
  REF_MPI ref_mpi_local;
  
  my_array_local._0_4_ = my_size;
  my_array_local._4_4_ = ldim;
  _my_size_local = ref_mpi;
  if (ref_mpi->n < 0) {
    printf("%s: %d: %s: %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_mpi.c",0x3da,
           "ref_mpi_allconcat","malloc counts of REF_INT negative");
    ref_mpi_local._4_4_ = 1;
  }
  else {
    counts_00 = (REF_INT *)malloc((long)ref_mpi->n << 2);
    if (counts_00 == (REF_INT *)0x0) {
      printf("%s: %d: %s: %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_mpi.c",0x3da,
             "ref_mpi_allconcat","malloc counts of REF_INT NULL");
      ref_mpi_local._4_4_ = 2;
    }
    else {
      uVar1 = ref_mpi_allgather(_my_size_local,&my_array_local,counts_00,1);
      if (uVar1 == 0) {
        *total_size = 0;
        for (tot = 0; tot < _my_size_local->n; tot = tot + 1) {
          *total_size = counts_00[tot] + *total_size;
        }
        if (*total_size < 0) {
          printf("%s: %d: %s: %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_mpi.c",
                 0x3e1,"ref_mpi_allconcat","malloc *source of REF_INT negative");
          ref_mpi_local._4_4_ = 1;
        }
        else {
          pRVar2 = (REF_INT *)malloc((long)*total_size << 2);
          *source = pRVar2;
          if (*source == (REF_INT *)0x0) {
            printf("%s: %d: %s: %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_mpi.c",
                   0x3e1,"ref_mpi_allconcat","malloc *source of REF_INT NULL");
            ref_mpi_local._4_4_ = 2;
          }
          else {
            counts._4_4_ = 0;
            for (tot = 0; tot < _my_size_local->n; tot = tot + 1) {
              for (local_40 = 0; local_40 < counts_00[tot]; local_40 = local_40 + 1) {
                (*source)[counts._4_4_] = tot;
                counts._4_4_ = counts._4_4_ + 1;
              }
            }
            if ((long)*total_size == (long)counts._4_4_) {
              if (type == 1) {
                if (my_array_local._4_4_ * *total_size < 0) {
                  printf("%s: %d: %s: %s\n",
                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_mpi.c"
                         ,0x3ec,"ref_mpi_allconcat",
                         "malloc *((REF_INT **)concatenated) of REF_INT negative");
                  return 1;
                }
                pvVar3 = malloc((long)(my_array_local._4_4_ * *total_size) << 2);
                *concatenated = pvVar3;
                if (*concatenated == (void *)0x0) {
                  printf("%s: %d: %s: %s\n",
                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_mpi.c"
                         ,0x3ec,"ref_mpi_allconcat",
                         "malloc *((REF_INT **)concatenated) of REF_INT NULL");
                  return 2;
                }
              }
              else {
                if (type != 3) {
                  printf("%s: %d: %s: %d %s\n",
                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_mpi.c"
                         ,0x3f2,"ref_mpi_allconcat",6,"data type");
                  return 6;
                }
                if (my_array_local._4_4_ * *total_size < 0) {
                  printf("%s: %d: %s: %s\n",
                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_mpi.c"
                         ,0x3ef,"ref_mpi_allconcat",
                         "malloc *((REF_DBL **)concatenated) of REF_DBL negative");
                  return 1;
                }
                pvVar3 = malloc((long)(my_array_local._4_4_ * *total_size) << 3);
                *concatenated = pvVar3;
                if (*concatenated == (void *)0x0) {
                  printf("%s: %d: %s: %s\n",
                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_mpi.c"
                         ,0x3ef,"ref_mpi_allconcat",
                         "malloc *((REF_DBL **)concatenated) of REF_DBL NULL");
                  return 2;
                }
              }
              for (tot = 0; tot < _my_size_local->n; tot = tot + 1) {
                counts_00[tot] = my_array_local._4_4_ * counts_00[tot];
              }
              uVar1 = ref_mpi_allgatherv(_my_size_local,my_array,counts_00,*concatenated,type);
              if (uVar1 == 0) {
                if (counts_00 != (REF_INT *)0x0) {
                  free(counts_00);
                }
                ref_mpi_local._4_4_ = 0;
              }
              else {
                printf("%s: %d: %s: %d %s\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_mpi.c"
                       ,0x3f9,"ref_mpi_allconcat",(ulong)uVar1,"gather values");
                ref_mpi_local._4_4_ = uVar1;
              }
            }
            else {
              printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_mpi.c"
                     ,1000,"ref_mpi_allconcat","count mismatch",(long)*total_size,(long)counts._4_4_
                    );
              ref_mpi_local._4_4_ = 1;
            }
          }
        }
      }
      else {
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_mpi.c",0x3dd
               ,"ref_mpi_allconcat",(ulong)uVar1,"gather size");
        ref_mpi_local._4_4_ = uVar1;
      }
    }
  }
  return ref_mpi_local._4_4_;
}

Assistant:

REF_FCN REF_STATUS ref_mpi_allconcat(REF_MPI ref_mpi, REF_INT ldim,
                                     REF_INT my_size, void *my_array,
                                     REF_INT *total_size, REF_INT **source,
                                     void **concatenated, REF_TYPE type) {
  REF_INT proc, i, tot;
  REF_INT *counts;

  ref_malloc(counts, ref_mpi_n(ref_mpi), REF_INT);
  RSS(ref_mpi_allgather(ref_mpi, (void *)(&my_size), (void *)counts,
                        REF_INT_TYPE),
      "gather size");

  *total_size = 0;
  each_ref_mpi_part(ref_mpi, proc)(*total_size) += counts[proc];
  ref_malloc(*source, *total_size, REF_INT);

  tot = 0;
  each_ref_mpi_part(ref_mpi, proc) for (i = 0; i < counts[proc]; i++) {
    (*source)[tot] = proc;
    tot++;
  }
  REIS(*total_size, tot, "count mismatch");

  switch (type) {
    case REF_INT_TYPE:
      ref_malloc(*((REF_INT **)concatenated), ldim * (*total_size), REF_INT);
      break;
    case REF_DBL_TYPE:
      ref_malloc(*((REF_DBL **)concatenated), ldim * (*total_size), REF_DBL);
      break;
    default:
      RSS(REF_IMPLEMENT, "data type");
  }

  /* pad ldim */
  each_ref_mpi_part(ref_mpi, proc) counts[proc] *= ldim;

  RSS(ref_mpi_allgatherv(ref_mpi, my_array, counts, *concatenated, type),
      "gather values");

  ref_free(counts);

  return REF_SUCCESS;
}